

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O3

void format_dice_string(random_value *v,int multiplier,size_t len,char *dice_string)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  char *fmt;
  
  uVar4 = (ulong)(uint)multiplier;
  uVar1 = v->base;
  uVar2 = v->dice;
  if (uVar2 == 0) {
    strnfmt((char *)len,0x14,"%d",(ulong)(uVar1 * multiplier));
    return;
  }
  if (uVar1 == 0) {
    uVar3 = v->sides;
    if (multiplier == 1) {
      strnfmt((char *)len,0x14,"%dd%d",(ulong)uVar2,(ulong)uVar3);
      return;
    }
    fmt = "%d*(%dd%d)";
  }
  else {
    if (multiplier != 1) {
      strnfmt((char *)len,0x14,"%d+%d*(%dd%d)",(ulong)(uVar1 * multiplier),uVar4,(ulong)uVar2,
              CONCAT44((int)((ulong)in_RAX >> 0x20),v->sides));
      return;
    }
    uVar3 = v->sides;
    fmt = "%d+%dd%d";
    uVar4 = (ulong)uVar1;
  }
  strnfmt((char *)len,0x14,fmt,uVar4,(ulong)uVar2,(ulong)uVar3);
  return;
}

Assistant:

static void format_dice_string(const random_value *v, int multiplier,
	size_t len, char* dice_string)
{
	if (v->dice && v->base) {
		if (multiplier == 1) {
			strnfmt(dice_string, len, "%d+%dd%d", v->base, v->dice,
				v->sides);
		} else {
			strnfmt(dice_string, len, "%d+%d*(%dd%d)",
				multiplier * v->base, multiplier, v->dice,
				v->sides);
		}
	} else if (v->dice) {
		if (multiplier == 1) {
			strnfmt(dice_string, len, "%dd%d", v->dice, v->sides);
		} else {
			strnfmt(dice_string, len, "%d*(%dd%d)", multiplier,
				v->dice, v->sides);
		}
	} else {
		strnfmt(dice_string, len, "%d", multiplier * v->base);
	}
}